

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

void iDynTree::reportDebug(char *className,char *methodName,char *message)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[DEBUG] ",8);
  if (className == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x162248);
  }
  else {
    sVar1 = strlen(className);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,className,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," :: ",4);
  if (methodName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x162248);
  }
  else {
    sVar1 = strlen(methodName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,methodName,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," : ",3);
  if (message == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x162248);
  }
  else {
    sVar1 = strlen(message);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,message,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  return;
}

Assistant:

void reportDebug(const char* className, const char* methodName, const char* message)
    {
        std::cerr << "[DEBUG] " << className << " :: " << methodName << " : " << message <<  "\n";
    }